

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.h
# Opt level: O2

void SpookyHash::EndPartial
               (uint64 *h0,uint64 *h1,uint64 *h2,uint64 *h3,uint64 *h4,uint64 *h5,uint64 *h6,
               uint64 *h7,uint64 *h8,uint64 *h9,uint64 *h10,uint64 *h11)

{
  uint64 uVar1;
  uint64 uVar2;
  
  uVar1 = *h11;
  uVar2 = *h1;
  *h11 = uVar1 + uVar2;
  *h2 = *h2 ^ uVar1 + uVar2;
  *h1 = *h1 << 0x2c | *h1 >> 0x14;
  uVar1 = *h0;
  uVar2 = *h2;
  *h0 = uVar1 + uVar2;
  *h3 = *h3 ^ uVar1 + uVar2;
  *h2 = *h2 << 0xf | *h2 >> 0x31;
  uVar1 = *h1;
  uVar2 = *h3;
  *h1 = uVar1 + uVar2;
  *h4 = *h4 ^ uVar1 + uVar2;
  *h3 = *h3 << 0x22 | *h3 >> 0x1e;
  uVar1 = *h2;
  uVar2 = *h4;
  *h2 = uVar1 + uVar2;
  *h5 = *h5 ^ uVar1 + uVar2;
  *h4 = *h4 << 0x15 | *h4 >> 0x2b;
  uVar1 = *h3;
  uVar2 = *h5;
  *h3 = uVar1 + uVar2;
  *h6 = *h6 ^ uVar1 + uVar2;
  *h5 = *h5 << 0x26 | *h5 >> 0x1a;
  uVar1 = *h4;
  uVar2 = *h6;
  *h4 = uVar1 + uVar2;
  *h7 = *h7 ^ uVar1 + uVar2;
  *h6 = *h6 << 0x21 | *h6 >> 0x1f;
  uVar1 = *h5;
  uVar2 = *h7;
  *h5 = uVar1 + uVar2;
  *h8 = *h8 ^ uVar1 + uVar2;
  *h7 = *h7 << 10 | *h7 >> 0x36;
  uVar1 = *h6;
  uVar2 = *h8;
  *h6 = uVar1 + uVar2;
  *h9 = *h9 ^ uVar1 + uVar2;
  *h8 = *h8 << 0xd | *h8 >> 0x33;
  uVar1 = *h7;
  uVar2 = *h9;
  *h7 = uVar1 + uVar2;
  *h10 = *h10 ^ uVar1 + uVar2;
  *h9 = *h9 << 0x26 | *h9 >> 0x1a;
  uVar1 = *h8;
  uVar2 = *h10;
  *h8 = uVar1 + uVar2;
  *h11 = *h11 ^ uVar1 + uVar2;
  *h10 = *h10 << 0x35 | *h10 >> 0xb;
  uVar1 = *h9;
  uVar2 = *h11;
  *h9 = uVar1 + uVar2;
  *h0 = *h0 ^ uVar1 + uVar2;
  *h11 = *h11 << 0x2a | *h11 >> 0x16;
  uVar1 = *h10;
  uVar2 = *h0;
  *h10 = uVar1 + uVar2;
  *h1 = *h1 ^ uVar1 + uVar2;
  *h0 = *h0 << 0x36 | *h0 >> 10;
  return;
}

Assistant:

static INLINE void EndPartial(
        uint64 &h0, uint64 &h1, uint64 &h2, uint64 &h3,
        uint64 &h4, uint64 &h5, uint64 &h6, uint64 &h7, 
        uint64 &h8, uint64 &h9, uint64 &h10,uint64 &h11)
    {
        h11+= h1;    h2 ^= h11;   h1 = Rot64(h1,44);
	h0 += h2;    h3 ^= h0;    h2 = Rot64(h2,15);
	h1 += h3;    h4 ^= h1;    h3 = Rot64(h3,34);
	h2 += h4;    h5 ^= h2;    h4 = Rot64(h4,21);
	h3 += h5;    h6 ^= h3;    h5 = Rot64(h5,38);
	h4 += h6;    h7 ^= h4;    h6 = Rot64(h6,33);
	h5 += h7;    h8 ^= h5;    h7 = Rot64(h7,10);
	h6 += h8;    h9 ^= h6;    h8 = Rot64(h8,13);
	h7 += h9;    h10^= h7;    h9 = Rot64(h9,38);
	h8 += h10;   h11^= h8;    h10= Rot64(h10,53);
	h9 += h11;   h0 ^= h9;    h11= Rot64(h11,42);
	h10+= h0;    h1 ^= h10;   h0 = Rot64(h0,54);
    }